

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::_::Mutex::checkPredicate(kj::_::Mutex::Waiter&)::__0>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_16_2_758bdefe *func)

{
  anon_class_16_2_758bdefe *func_local;
  
  _::Mutex::checkPredicate::anon_class_16_2_758bdefe::operator()((anon_class_16_2_758bdefe *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}